

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateInfo.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall helics::FederateInfo::loadInfoFromArgs(FederateInfo *this,string *args)

{
  string_view message;
  ParseOutput PVar1;
  char *__str;
  pointer this_00;
  char *in_RSI;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  App *in_stack_00000048;
  FederateInfo *in_stack_00000050;
  ParseOutput ret;
  unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> app;
  helicsCLI11App *in_stack_00000070;
  FederateInfo *in_stack_00001f68;
  unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
  *in_stack_ffffffffffffff90;
  basic_string_view<char,_std::char_traits<char>_> *pbVar2;
  undefined4 in_stack_ffffffffffffffd8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffe0;
  
  pbVar2 = in_RDI;
  makeCLIApp(in_stack_00001f68);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             0x36d87e);
  PVar1 = helicsCLI11App::helics_parse<std::__cxx11::string_const&>
                    (in_stack_00000070,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  if (PVar1 == PARSE_ERROR) {
    __str = (char *)__cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(in_RDI,__str);
    message._M_str = in_RSI;
    message._M_len = (size_t)pbVar2;
    InvalidParameter::InvalidParameter((InvalidParameter *)in_RDI,message);
    __cxa_throw(__str,&InvalidParameter::typeinfo,InvalidParameter::~InvalidParameter);
  }
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::get
            (in_stack_ffffffffffffff90);
  config_additional(in_stack_00000050,in_stack_00000048);
  this_00 = CLI::std::
            unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
            operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                        *)0x36d921);
  helicsCLI11App::remainArgs_abi_cxx11_(this_00);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_stack_ffffffffffffffe0,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)CONCAT44(PVar1,in_stack_ffffffffffffffd8));
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  ~unique_ptr((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
              in_RDI);
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)pbVar2;
}

Assistant:

std::vector<std::string> FederateInfo::loadInfoFromArgs(const std::string& args)
{
    auto app = makeCLIApp();
    auto ret = app->helics_parse(args);
    if (ret == helicsCLI11App::ParseOutput::PARSE_ERROR) {
        throw helics::InvalidParameter("argument parsing failed");
    }
    config_additional(app.get());
    return app->remainArgs();
}